

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void cave_store(chunk *c,char *name,_Bool known,_Bool keep_all)

{
  char *pcVar1;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,keep_all) == 0) {
    c = (chunk *)chunk_write((chunk_conflict *)c);
  }
  if (c->name != (char *)0x0) {
    string_free(c->name);
  }
  pcVar1 = string_make(name);
  c->name = pcVar1;
  if (known) {
    pcVar1 = string_append(pcVar1," known");
    c->name = pcVar1;
  }
  c->turn = turn;
  chunk_list_add((chunk_conflict *)c);
  return;
}

Assistant:

static void cave_store(struct chunk *c, char *name, bool known, bool keep_all)
{
	struct chunk *stored;
	if (keep_all) {
		stored = c;
	} else {
		stored = chunk_write(c);
	}
	if (stored->name) {
		string_free(stored->name);
	}
	stored->name = string_make(name);
	if (known) {
		stored->name = string_append(stored->name, " known");
	}
	stored->turn = turn;
	chunk_list_add(stored);
}